

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input.cxx
# Opt level: O3

int __thiscall Fl_Input::kf_move_word_left(Fl_Input *this)

{
  int p;
  int m;
  
  p = Fl_Input_::word_start(&this->super_Fl_Input_,(this->super_Fl_Input_).position_);
  m = p;
  if (((uint)Fl::e_state >> 0x10 & 1) != 0) {
    m = (this->super_Fl_Input_).mark_;
  }
  Fl_Input_::position(&this->super_Fl_Input_,p,m);
  return 1;
}

Assistant:

int Fl_Input::kf_move_word_left() {
  shift_position(word_start(position()));
  return 1; 
}